

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O3

int copy_file_data_block(bsdtar *bsdtar,archive *a,archive *in_a,archive_entry *entry)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  long progress;
  size_t s;
  int64_t sparse;
  ulong uVar6;
  ulong uVar7;
  size_t bytes_read;
  void *buff;
  int64_t offset;
  size_t local_58;
  archive_entry *local_50;
  void *local_48;
  long local_40;
  archive *local_38;
  
  iVar2 = archive_read_data_block(in_a,&local_48,&local_58,&local_40);
  if (iVar2 == 0) {
    pcVar3 = (char *)0x0;
    progress = 0;
    local_50 = entry;
    local_38 = in_a;
    do {
      iVar2 = need_report();
      if (iVar2 != 0) {
        report_write((bsdtar *)(ulong)(uint)bsdtar->verbose,a,entry,progress);
      }
      uVar6 = local_40 - progress;
      if (uVar6 != 0 && progress <= local_40) {
        if (pcVar3 == (char *)0x0) {
          pcVar3 = bsdtar->buff;
          memset(pcVar3,0,bsdtar->buff_size);
        }
        if (0 < (long)uVar6) {
          do {
            s = bsdtar->buff_size;
            if ((long)uVar6 < (long)bsdtar->buff_size) {
              s = uVar6;
            }
            uVar4 = archive_write_data(a,pcVar3,s);
            if ((long)uVar4 < 0) goto LAB_00110518;
            entry = local_50;
            if (uVar4 < s) goto LAB_0011053f;
            progress = progress + uVar4;
            uVar7 = uVar6 - uVar4;
            bVar1 = (long)uVar4 <= (long)uVar6;
            uVar6 = uVar7;
          } while (uVar7 != 0 && bVar1);
        }
      }
      uVar6 = archive_write_data(a,local_48,local_58);
      if ((long)uVar6 < 0) {
LAB_00110518:
        pcVar3 = archive_error_string(a);
        iVar2 = 0;
        goto LAB_00110529;
      }
      if (uVar6 < local_58) {
LAB_0011053f:
        pcVar3 = archive_entry_pathname(entry);
        lafe_warnc(0,"%s: Truncated write; file may have grown while being archived.",pcVar3);
        return 0;
      }
      progress = progress + uVar6;
      iVar2 = archive_read_data_block(local_38,&local_48,&local_58,&local_40);
    } while (iVar2 == 0);
  }
  iVar5 = 0;
  if (iVar2 < -0x14) {
    iVar2 = archive_errno(a);
    pcVar3 = archive_error_string(a);
LAB_00110529:
    lafe_warnc(iVar2,"%s",pcVar3);
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int
copy_file_data_block(struct bsdtar *bsdtar, struct archive *a,
    struct archive *in_a, struct archive_entry *entry)
{
	size_t	bytes_read;
	ssize_t	bytes_written;
	int64_t	offset, progress = 0;
	char *null_buff = NULL;
	const void *buff;
	int r;

	while ((r = archive_read_data_block(in_a, &buff,
	    &bytes_read, &offset)) == ARCHIVE_OK) {
		if (need_report())
			report_write(bsdtar, a, entry, progress);

		if (offset > progress) {
			int64_t sparse = offset - progress;
			size_t ns;

			if (null_buff == NULL) {
				null_buff = bsdtar->buff;
				memset(null_buff, 0, bsdtar->buff_size);
			}

			while (sparse > 0) {
				if (sparse > (int64_t)bsdtar->buff_size)
					ns = bsdtar->buff_size;
				else
					ns = (size_t)sparse;
				bytes_written =
				    archive_write_data(a, null_buff, ns);
				if (bytes_written < 0) {
					/* Write failed; this is bad */
					lafe_warnc(0, "%s",
					     archive_error_string(a));
					return (-1);
				}
				if ((size_t)bytes_written < ns) {
					/* Write was truncated; warn but
					 * continue. */
					lafe_warnc(0,
					    "%s: Truncated write; file may "
					    "have grown while being archived.",
					    archive_entry_pathname(entry));
					return (0);
				}
				progress += bytes_written;
				sparse -= bytes_written;
			}
		}

		bytes_written = archive_write_data(a, buff, bytes_read);
		if (bytes_written < 0) {
			/* Write failed; this is bad */
			lafe_warnc(0, "%s", archive_error_string(a));
			return (-1);
		}
		if ((size_t)bytes_written < bytes_read) {
			/* Write was truncated; warn but continue. */
			lafe_warnc(0,
			    "%s: Truncated write; file may have grown "
			    "while being archived.",
			    archive_entry_pathname(entry));
			return (0);
		}
		progress += bytes_written;
	}
	if (r < ARCHIVE_WARN) {
		lafe_warnc(archive_errno(a), "%s", archive_error_string(a));
		return (-1);
	}
	return (0);
}